

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
* build_column_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             *__return_storage_ptr__,Column_settings *settings)

{
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  allocator_type local_61;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_60;
  int local_44;
  Column_settings *local_40;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_38;
  undefined8 uStack_20;
  undefined8 local_18;
  
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000001;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000003;
  uStack_20 = 0x400000005;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_60,__l,&local_61);
  local_44 = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
              *)__return_storage_ptr__,&local_60,&local_44,&local_40);
  if (local_60.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x400000000;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000001;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000002;
  uStack_20 = 0x100000005;
  local_18 = 0x100000006;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_38;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_60,__l_00,&local_61);
  local_44 = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
              *)__return_storage_ptr__,&local_60,&local_44,&local_40);
  if (local_60.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x300000001;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x400000002;
  uStack_20 = 0x400000005;
  local_18 = 0x400000006;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&local_38;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_60,__l_01,&local_61);
  local_44 = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
              *)__return_storage_ptr__,&local_60,&local_44,&local_40);
  if (local_60.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (Column_settings *)CONCAT44(local_40._4_4_,4);
  local_60.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)settings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
              *)__return_storage_ptr__,&local_38,(int *)&local_40,(Column_zp_settings **)&local_60);
  if ((pair<unsigned_int,_unsigned_int>)
      local_38.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000001;
  local_38.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000003;
  uStack_20 = 0x400000005;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_38;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_60,__l_02,&local_61);
  local_44 = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
              *)__return_storage_ptr__,&local_60,&local_44,&local_40);
  if (local_60.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
  ::
  emplace_back<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>>
              *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Column> build_column_matrix(typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;

    matrix.emplace_back(cont{0, 1, 3, 5}, 4, &settings);
    matrix.emplace_back(cont{0, 1, 2, 5, 6}, 4, &settings);
    matrix.emplace_back(cont{0, 1, 2, 5, 6}, 4, &settings);
    matrix.emplace_back(cont{}, 4, &settings);
    matrix.emplace_back(cont{0, 1, 3, 5}, 4, &settings);
    matrix.emplace_back(matrix[1]);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &settings);
    matrix.emplace_back(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, 4, &settings);
    matrix.emplace_back(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, 4, &settings);
    matrix.emplace_back(cont{}, 4, &settings);
    matrix.emplace_back(cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &settings);
    matrix.emplace_back(matrix[1]);
  }

  return matrix;
}